

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

BCLine lj_debug_line(GCproto *pt,BCPos pc)

{
  uint64_t uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = (pt->lineinfo).ptr64;
  iVar2 = 0;
  if (uVar1 != 0 && pc <= pt->sizebc) {
    iVar2 = pt->firstline;
    if (pt->sizebc == pc) {
      return iVar2 + pt->numline;
    }
    if (pc != 0) {
      uVar4 = (ulong)(pc - 1);
      if (pt->numline < 0x100) {
        uVar3 = (uint)*(byte *)(uVar1 + uVar4);
      }
      else {
        if (0xffff < pt->numline) {
          return iVar2 + *(int *)(uVar1 + uVar4 * 4);
        }
        uVar3 = (uint)*(ushort *)(uVar1 + uVar4 * 2);
      }
      return iVar2 + uVar3;
    }
  }
  return iVar2;
}

Assistant:

BCLine LJ_FASTCALL lj_debug_line(GCproto *pt, BCPos pc)
{
  const void *lineinfo = proto_lineinfo(pt);
  if (pc <= pt->sizebc && lineinfo) {
    BCLine first = pt->firstline;
    if (pc == pt->sizebc) return first + pt->numline;
    if (pc-- == 0) return first;
    if (pt->numline < 256)
      return first + (BCLine)((const uint8_t *)lineinfo)[pc];
    else if (pt->numline < 65536)
      return first + (BCLine)((const uint16_t *)lineinfo)[pc];
    else
      return first + (BCLine)((const uint32_t *)lineinfo)[pc];
  }
  return 0;
}